

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_permute_rows(m2v *M,int *rowperm)

{
  int iVar1;
  m2v_base *pmVar2;
  size_t __n;
  ulong uVar3;
  int iVar4;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  void *__dest;
  void *__s;
  undefined8 uStack_50;
  m2v_base amStack_48 [2];
  ulong local_40;
  size_t local_38;
  ulong uVar5;
  
  uVar6 = M->n_row;
  lVar8 = -((ulong)uVar6 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)amStack_48 + lVar8);
  if (0 < (int)uVar6) {
    *(undefined8 *)((long)&uStack_50 + lVar8) = 0x102fd7;
    memset(__s,0,(ulong)uVar6);
  }
  uVar6 = M->n_col;
  uVar9 = (ulong)uVar6;
  iVar4 = uVar6 + 0x3e;
  if (-1 < (int)(uVar6 + 0x1f)) {
    iVar4 = uVar6 + 0x1f;
  }
  uVar6 = iVar4 >> 5;
  __dest = (void *)((long)__s - ((ulong)uVar6 * 4 + 0xf & 0xfffffffffffffff0));
  if (0 < M->n_row) {
    local_38 = (ulong)(uVar6 + (uVar6 == 0)) << 2;
    uVar10 = 0;
    local_40 = uVar9;
    do {
      __n = local_38;
      if (*(char *)((long)__s + uVar10) == '\0') {
        if (uVar10 == (uint)rowperm[uVar10]) {
          *(undefined1 *)((long)__s + uVar10) = 1;
        }
        else {
          iVar4 = (int)uVar10;
          if (0 < (int)uVar9) {
            iVar1 = M->row_stride;
            pmVar2 = M->e;
            *(undefined8 *)((long)__dest + -8) = 0x103064;
            memcpy(__dest,pmVar2 + (long)iVar4 * (long)iVar1,__n);
            uVar9 = local_40;
          }
          if (uVar10 != (uint)rowperm[uVar10]) {
            uVar3 = (ulong)(uint)rowperm[uVar10];
            uVar7 = uVar10 & 0xffffffff;
            do {
              uVar5 = uVar3;
              iVar4 = (int)uVar5;
              *(undefined1 *)((long)__s + (long)iVar4) = 1;
              iVar1 = M->row_stride;
              if (0 < iVar1) {
                pmVar2 = M->e;
                lVar8 = 0;
                do {
                  pmVar2[(int)uVar7 * iVar1 + lVar8] = pmVar2[iVar1 * iVar4 + lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 < M->row_stride);
              }
              uVar3 = (ulong)(uint)rowperm[iVar4];
              uVar7 = uVar5;
            } while (uVar10 != (uint)rowperm[iVar4]);
          }
          *(undefined1 *)((long)__s + uVar10) = 1;
          iVar1 = M->row_stride;
          if (0 < iVar1) {
            pmVar2 = M->e;
            lVar8 = 0;
            do {
              pmVar2[iVar1 * iVar4 + lVar8] = *(m2v_base *)((long)__dest + lVar8 * 4);
              lVar8 = lVar8 + 1;
            } while (lVar8 < M->row_stride);
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)M->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_rows)(MV_GEN_TYPE* M, const int* rowperm)
{
	char visited[M->n_row];
	for (int i = 0; i < M->n_row; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(rowbuf_mat, rowbuf, 1, M->n_col)
	for (int i = 0; i < M->n_row; ++i) {
		if (visited[i])
			continue;
		if (rowperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_row)(M, i, &rowbuf_mat, 0);
		int e = i, e_next = rowperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_row)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = rowperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_row)(&rowbuf_mat, 0, M, e);
	}
}